

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::LightBase::LightBase
          (LightBase *this,LightType type,Transform *renderFromLight,
          MediumInterface *mediumInterface)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long in_FS_OFFSET;
  
  this->type = type;
  (this->mediumInterface).inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->mediumInterface).inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->inside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->mediumInterface).outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->mediumInterface).outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->outside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  uVar1 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar2 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar3 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar4 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar5 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar6 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar7 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar8 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar9 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar10 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar11 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar12 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar13 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar14 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar15 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->renderFromLight).m.m[0] = *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->renderFromLight).m.m[0] + 2) = uVar1;
  *(undefined8 *)(this->renderFromLight).m.m[1] = uVar2;
  *(undefined8 *)((this->renderFromLight).m.m[1] + 2) = uVar3;
  *(undefined8 *)(this->renderFromLight).m.m[2] = uVar4;
  *(undefined8 *)((this->renderFromLight).m.m[2] + 2) = uVar5;
  *(undefined8 *)(this->renderFromLight).m.m[3] = uVar6;
  *(undefined8 *)((this->renderFromLight).m.m[3] + 2) = uVar7;
  *(undefined8 *)(this->renderFromLight).mInv.m[0] = uVar8;
  *(undefined8 *)((this->renderFromLight).mInv.m[0] + 2) = uVar9;
  *(undefined8 *)(this->renderFromLight).mInv.m[1] = uVar10;
  *(undefined8 *)((this->renderFromLight).mInv.m[1] + 2) = uVar11;
  *(undefined8 *)(this->renderFromLight).mInv.m[2] = uVar12;
  *(undefined8 *)((this->renderFromLight).mInv.m[2] + 2) = uVar13;
  *(undefined8 *)(this->renderFromLight).mInv.m[3] = uVar14;
  *(undefined8 *)((this->renderFromLight).mInv.m[3] + 2) = uVar15;
  *(long *)(in_FS_OFFSET + -0x3a8) = *(long *)(in_FS_OFFSET + -0x3a8) + 1;
  return;
}

Assistant:

LightBase::LightBase(LightType type, const Transform &renderFromLight,
                     const MediumInterface &mediumInterface)
    : type(type), mediumInterface(mediumInterface), renderFromLight(renderFromLight) {
    ++numLights;
}